

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.c
# Opt level: O1

void * encrypt_thread(void *pargs)

{
  uint uVar1;
  ulong ilen;
  size_t length;
  uint8_t iv [16];
  sha256_context ctx;
  aes_context aes;
  sha256_context tmp;
  uint8_t buffer [32816];
  uint local_8288 [2];
  long local_8280;
  undefined8 local_8278;
  undefined8 uStack_8270;
  sha256_context local_8260;
  aes_context local_81f8;
  sha256_context local_80d0;
  uchar local_8068 [32824];
  
  local_8278 = *(undefined8 *)((long)pargs + 0x28);
  uStack_8270 = *(undefined8 *)((long)pargs + 0x30);
  aes_init(&local_81f8,(uint8_t *)((long)pargs + 8),0x100);
  aes_ecb_encrypt(&local_81f8,(uint8_t *)&local_8278,(uint8_t *)&local_8278);
  write_block(*(int *)((long)pargs + 4),&local_8278,0x10);
  sha256_init(&local_8260);
  sha256_starts(&local_8260);
  local_8280 = 0x10;
  local_8288[0] = 0;
  local_8288[1] = 0;
  ilen = read_block(*pargs,local_8068,0x8000);
  if (0 < (long)ilen) {
    do {
      sha256_update(&local_8260,local_8068,ilen);
      sha256_copy(&local_80d0,&local_8260);
      sha256_final(&local_80d0,local_8068 + ilen);
      if (local_8288[0] != 0) {
        encrypt_thread_cold_1();
        goto LAB_00102e6a;
      }
      length = ilen + 0x20;
      if ((ilen & 0xf) != 0) {
        uVar1 = 0x10 - (int)(ilen & 0xf);
        local_8288[0] = uVar1;
        length = length + uVar1;
      }
      aes_cbc_encrypt(&local_81f8,(uint8_t *)&local_8278,local_8068,length,local_8068);
      local_8278 = *(undefined8 *)(local_8068 + (length - 0x10));
      uStack_8270 = *(undefined8 *)(local_80d0.buffer + length + 0x38);
      write_block(*(int *)((long)pargs + 4),local_8068,length);
      local_8280 = local_8280 + length;
      ilen = read_block(*pargs,local_8068,0x8000);
    } while (0 < (long)ilen);
  }
  if ((long)ilen < 0) {
    encrypt_thread_cold_2();
  }
  else {
    local_8280 = local_8280 + 0x10;
    aes_cbc_encrypt(&local_81f8,(uint8_t *)&local_8278,(uint8_t *)local_8288,0x10,
                    (uint8_t *)local_8288);
    write_block(*(int *)((long)pargs + 4),local_8288,0x10);
  }
LAB_00102e6a:
  close(*(int *)((long)pargs + 4));
  close(*pargs);
  return (void *)0x0;
}

Assistant:

void *encrypt_thread(void *pargs) {
  args_t *args = (args_t *)pargs;
  sha256_context ctx, tmp;
  aes_context aes;
  uint8_t iv[AES_BLOCK_SIZE];
  uint8_t buffer[PSVIMG_BLOCK_SIZE + SHA256_BLOCK_SIZE + 0x10];
  ssize_t rd;
  union {
    struct {
      uint32_t padding;
      uint32_t unused;
      uint64_t total;
    } __attribute__((packed)) data;
    uint8_t raw[AES_BLOCK_SIZE];
  } footer;

  // write iv
  memcpy(iv, args->iv, AES_BLOCK_SIZE);
  aes_init(&aes, args->key, 256);
  aes_ecb_encrypt(&aes, iv, iv);
  write_block(args->out, iv, AES_BLOCK_SIZE);

  // encrypt blocks
  sha256_init(&ctx);
  sha256_starts(&ctx);
  footer.data.total = AES_BLOCK_SIZE; // from iv
  footer.data.padding = 0;
  footer.data.unused = 0;
  while ((rd = read_block(args->in, buffer, PSVIMG_BLOCK_SIZE)) > 0) {
    // generate hash
    sha256_update(&ctx, buffer, rd);
    sha256_copy(&tmp, &ctx);
    sha256_final(&tmp, &buffer[rd]);
    rd += SHA256_BLOCK_SIZE;

    // add padding
    if (footer.data.padding != 0) { // we should be reading 0x8000 blocks! only need padding once
      fprintf(stderr, "an internal error has occured!\n");
      goto end;
    }
    if (rd & (AES_BLOCK_SIZE-1)) {
      footer.data.padding = AES_BLOCK_SIZE - (rd & (AES_BLOCK_SIZE-1));
      rd += footer.data.padding;
    }

    // encrypt
    aes_cbc_encrypt(&aes, iv, buffer, rd, buffer);

    // save next iv
    memcpy(iv, &buffer[rd - AES_BLOCK_SIZE], AES_BLOCK_SIZE);

    // write output
    write_block(args->out, buffer, rd);

    footer.data.total += rd;
  }

  if (rd < 0) {
    fprintf(stderr, "Read error occured!\n");
    goto end;
  }

  // send footer
  footer.data.total += 0x10;
  footer.data.padding = htole32(footer.data.padding);
  footer.data.total = htole64(footer.data.total);
  aes_cbc_encrypt(&aes, iv, footer.raw, AES_BLOCK_SIZE, footer.raw);
  write_block(args->out, footer.raw, AES_BLOCK_SIZE);

end:
  close(args->out);
  close(args->in);
  return NULL;
}